

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix3 * matrix3_multiply(matrix3 *self,matrix3 *mT)

{
  undefined1 local_3c [8];
  matrix3 r;
  matrix3 *mT_local;
  matrix3 *self_local;
  
  r.field_0._28_8_ = mT;
  matrix3_identity((matrix3 *)local_3c);
  local_3c._0_4_ =
       (self->field_0).m[6] * *(float *)(r.field_0._28_8_ + 8) +
       (self->field_0).m[0] * *(float *)r.field_0._28_8_ +
       (self->field_0).m[3] * *(float *)(r.field_0._28_8_ + 4);
  local_3c._4_4_ =
       (self->field_0).m[7] * *(float *)(r.field_0._28_8_ + 8) +
       (self->field_0).m[1] * *(float *)r.field_0._28_8_ +
       (self->field_0).m[4] * *(float *)(r.field_0._28_8_ + 4);
  r.field_0.m[0] =
       (self->field_0).m[8] * *(float *)(r.field_0._28_8_ + 8) +
       (self->field_0).m[2] * *(float *)r.field_0._28_8_ +
       (self->field_0).m[5] * *(float *)(r.field_0._28_8_ + 4);
  r.field_0.m[1] =
       (self->field_0).m[6] * *(float *)(r.field_0._28_8_ + 0x14) +
       (self->field_0).m[0] * *(float *)(r.field_0._28_8_ + 0xc) +
       (self->field_0).m[3] * *(float *)(r.field_0._28_8_ + 0x10);
  r.field_0.m[2] =
       (self->field_0).m[7] * *(float *)(r.field_0._28_8_ + 0x14) +
       (self->field_0).m[1] * *(float *)(r.field_0._28_8_ + 0xc) +
       (self->field_0).m[4] * *(float *)(r.field_0._28_8_ + 0x10);
  r.field_0.m[3] =
       (self->field_0).m[8] * *(float *)(r.field_0._28_8_ + 0x14) +
       (self->field_0).m[2] * *(float *)(r.field_0._28_8_ + 0xc) +
       (self->field_0).m[5] * *(float *)(r.field_0._28_8_ + 0x10);
  r.field_0.m[4] =
       (self->field_0).m[6] * *(float *)(r.field_0._28_8_ + 0x20) +
       (self->field_0).m[0] * *(float *)(r.field_0._28_8_ + 0x18) +
       (self->field_0).m[3] * *(float *)(r.field_0._28_8_ + 0x1c);
  r.field_0.m[5] =
       (self->field_0).m[7] * *(float *)(r.field_0._28_8_ + 0x20) +
       (self->field_0).m[1] * *(float *)(r.field_0._28_8_ + 0x18) +
       (self->field_0).m[4] * *(float *)(r.field_0._28_8_ + 0x1c);
  r.field_0.m[6] =
       (self->field_0).m[8] * *(float *)(r.field_0._28_8_ + 0x20) +
       (self->field_0).m[2] * *(float *)(r.field_0._28_8_ + 0x18) +
       (self->field_0).m[5] * *(float *)(r.field_0._28_8_ + 0x1c);
  matrix3_set(self,(matrix3 *)local_3c);
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_multiply(struct matrix3 *self, const struct matrix3 *mT)
{
	/* mT is the multiplicand */

	struct matrix3 r;

	matrix3_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10 + self->c02 * mT->c20;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10 + self->c12 * mT->c20;
	r.r02 = self->c20 * mT->c00 + self->c21 * mT->c10 + self->c22 * mT->c20;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11 + self->c02 * mT->c21;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11 + self->c12 * mT->c21;
	r.r12 = self->c20 * mT->c01 + self->c21 * mT->c11 + self->c22 * mT->c21;

	/* third row */
	r.r20 = self->c00 * mT->c02 + self->c01 * mT->c12 + self->c02 * mT->c22;
	r.r21 = self->c10 * mT->c02 + self->c11 * mT->c12 + self->c12 * mT->c22;
	r.r22 = self->c20 * mT->c02 + self->c21 * mT->c12 + self->c22 * mT->c22;

	matrix3_set(self, &r); /* overwrite/save it */

	return self;
}